

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_queue.h
# Opt level: O0

bool __thiscall buffer_queue<int>::pop(buffer_queue<int> *this,int *item)

{
  undefined1 local_30 [8];
  unique_lock<std::mutex> lck;
  int *item_local;
  buffer_queue<int> *this_local;
  
  lck._8_8_ = item;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->b_mutex);
  if ((this->b_size < 1) &&
     (std::condition_variable::wait((unique_lock *)&this->b_cond), this->b_size < 1)) {
    this_local._7_1_ = false;
  }
  else {
    this->b_first = (this->b_first + 1) % this->capacity;
    *(int *)lck._8_8_ = this->b_array[this->b_first];
    this->b_size = this->b_size + -1;
    if ((this->b_debug & 1U) != 0) {
      this->b_rcnt = this->b_rcnt + 1;
    }
    this_local._7_1_ = true;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return this_local._7_1_;
}

Assistant:

bool pop(T &item)
    {

        unique_lock<mutex> lck (b_mutex);
        if (b_size <= 0)
        {           
            b_cond.wait(lck);
            if(b_size <= 0) 
            {
                return false;
            }
        }

        b_first = (b_first + 1) % capacity;
        item = b_array[b_first];
        b_size--;
        if(b_debug)
        {
            b_rcnt++;
        }

        return true;       
    }